

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_mnist.cpp
# Opt level: O1

void printStats(Net *net,LabeledDataset *testSet,IntClassifier *metrics)

{
  ostream *poVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  ConfusionMatrix<int,_1> cm;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  local_48;
  
  (*(metrics->super_AClassifier<int,_1>)._vptr_AClassifier[2])(&local_48,metrics,testSet);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"E = ",4);
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 6;
  fVar2 = meanLossEstimate(net,testSet,0);
  poVar1 = std::ostream::_M_insert<double>((double)fVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"PPV = ",6);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar3 = notch::metrics::ConfusionMatrix<int,_1>::precision((ConfusionMatrix<int,_1> *)&local_48);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TPR = ",6);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar3 = notch::metrics::ConfusionMatrix<int,_1>::recall((ConfusionMatrix<int,_1> *)&local_48);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ACC = ",6);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar3 = notch::metrics::ConfusionMatrix<int,_1>::accuracy((ConfusionMatrix<int,_1> *)&local_48);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"F1 = ",5);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar3 = notch::metrics::ConfusionMatrix<int,_1>::precision((ConfusionMatrix<int,_1> *)&local_48);
  dVar4 = notch::metrics::ConfusionMatrix<int,_1>::recall((ConfusionMatrix<int,_1> *)&local_48);
  poVar1 = std::ostream::_M_insert<double>(((dVar3 + dVar3) * dVar4) / (dVar3 + dVar4));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  notch::core::std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

void printStats(Net &net, LabeledDataset &testSet, IntClassifier &metrics) {
    auto cm = metrics.test(testSet);
    cout << "E = "
        << setprecision(6)
        << meanLossEstimate(net, testSet) << " "
        << "PPV = "
        << setprecision(3)
        << cm.precision() << " "
        << "TPR = "
        << setprecision(3)
        << cm.recall() << " "
        << "ACC = "
        << setprecision(3)
        << cm.accuracy() << " "
        << "F1 = "
        << setprecision(3)
        << cm.F1score() << endl;
}